

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

Image<eos::core::Pixel<unsigned_char,_4>_> * __thiscall
eos::core::image::constant<eos::core::Pixel<unsigned_char,4>>
          (Image<eos::core::Pixel<unsigned_char,_4>_> *__return_storage_ptr__,image *this,int height
          ,int width,Pixel<unsigned_char,_4> value)

{
  Pixel<unsigned_char,_4> *pPVar1;
  int y;
  ulong uVar2;
  int x;
  int x_00;
  ulong uVar3;
  
  Image<eos::core::Pixel<unsigned_char,_4>_>::Image(__return_storage_ptr__,(int)this,height);
  uVar2 = 0;
  if (height < 1) {
    height = 0;
  }
  uVar3 = (ulong)this & 0xffffffff;
  if ((int)this < 1) {
    uVar3 = uVar2;
  }
  while (y = (int)uVar2, y != (int)uVar3) {
    for (x_00 = 0; height != x_00; x_00 = x_00 + 1) {
      pPVar1 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(__return_storage_ptr__,y,x_00)
      ;
      *(int *)(pPVar1->data_)._M_elems = width;
    }
    uVar2 = (ulong)(y + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Image<PixelType> constant(int height, int width, PixelType value) noexcept
{
    Image<PixelType> image(height, width);
    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {
            image(y, x) = value;
        }
    }
    return image;
}